

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.c
# Opt level: O0

int chain_segment_mix_bypass(mixed_segment *segment)

{
  byte bVar1;
  int iVar2;
  mixed_buffer *local_50;
  mixed_buffer *outb;
  mixed_buffer *inb;
  mixed_channel_t c;
  mixed_channel_t outc;
  mixed_segment *pmStack_38;
  mixed_channel_t inc;
  mixed_segment *out;
  mixed_segment *in;
  long *plStack_20;
  uint32_t count;
  vector *data;
  mixed_segment *segment_local;
  
  plStack_20 = (long *)segment->data;
  in._4_4_ = (int)plStack_20[1];
  if (in._4_4_ == 0) {
    segment_local._4_4_ = 1;
  }
  else {
    out = *(mixed_segment **)*plStack_20;
    pmStack_38 = *(mixed_segment **)(*plStack_20 + (ulong)(in._4_4_ - 1) * 8);
    data = (vector *)segment;
    iVar2 = mixed_segment_get(0x24,(void *)((long)&inb + 7),out);
    if (iVar2 == 0) {
      segment_local._4_4_ = 0;
    }
    else {
      iVar2 = mixed_segment_get(0x25,(void *)((long)&inb + 6),pmStack_38);
      if (iVar2 == 0) {
        segment_local._4_4_ = 0;
      }
      else {
        inb._5_1_ = 0;
        while( true ) {
          bVar1 = inb._6_1_;
          if (inb._7_1_ < inb._6_1_) {
            bVar1 = inb._7_1_;
          }
          if (bVar1 <= inb._5_1_) {
            return 1;
          }
          iVar2 = mixed_segment_get_in(0,(uint)inb._5_1_,&outb,out);
          if (iVar2 == 0) {
            return 0;
          }
          iVar2 = mixed_segment_get_out(0,(uint)inb._5_1_,&local_50,pmStack_38);
          if (iVar2 == 0) {
            return 0;
          }
          iVar2 = mixed_buffer_transfer(outb,local_50);
          if (iVar2 == 0) break;
          inb._5_1_ = inb._5_1_ + 1;
        }
        segment_local._4_4_ = 0;
      }
    }
  }
  return segment_local._4_4_;
}

Assistant:

int chain_segment_mix_bypass(struct mixed_segment *segment){
  struct vector *data = (struct vector *)segment->data;
  uint32_t count = data->count;

  if(count == 0) return 1;

  struct mixed_segment *in = data->data[0];
  struct mixed_segment *out = data->data[count-1];
  
  mixed_channel_t inc, outc;
  if(!mixed_segment_get(MIXED_IN_COUNT, &inc, in)) return 0;
  if(!mixed_segment_get(MIXED_OUT_COUNT, &outc, out)) return 0;
  
  for(mixed_channel_t c=0; c<MIN(inc,outc); ++c){
    struct mixed_buffer *inb, *outb;
    if(!mixed_segment_get_in(MIXED_BUFFER, c, &inb, in)) return 0;
    if(!mixed_segment_get_out(MIXED_BUFFER, c, &outb, out)) return 0;
    if(!mixed_buffer_transfer(inb, outb)) return 0;
  }
  return 1;
}